

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

int32_t ucurr_forLocaleAndDate_63
                  (char *locale,UDate date,int32_t index,UChar *buff,int32_t buffCapacity,
                  UErrorCode *ec)

{
  UErrorCode UVar1;
  int32_t iVar2;
  uint uVar3;
  int32_t iVar4;
  char *pcVar5;
  UResourceBundle *pUVar6;
  UResourceBundle *pUVar7;
  int32_t *piVar8;
  UErrorCode *ec_00;
  bool bVar9;
  UChar *src;
  UErrorCode localStatus;
  int32_t resLen;
  int32_t toLength;
  int32_t fromLength;
  char id [157];
  UErrorCode local_124;
  int32_t local_120;
  int32_t local_11c;
  ulong local_118;
  UResourceBundle *local_110;
  UResourceBundle *local_108;
  int32_t local_100 [2];
  double local_f8;
  UDate local_f0;
  UChar *local_e8;
  UResourceBundle *local_e0;
  char local_d8 [168];
  
  if (ec == (UErrorCode *)0x0) {
    return 0;
  }
  if (U_ZERO_ERROR < *ec) {
    return 0;
  }
  if (buff == (UChar *)0x0 && buffCapacity != 0) {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  local_124 = U_ZERO_ERROR;
  ec_00 = (UErrorCode *)0x9d;
  local_f0 = date;
  local_11c = uloc_getKeywordValue_63(locale,"currency",local_d8,0x9d,&local_124);
  idForLocale(locale,local_d8,(int)ec,ec_00);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar5 = strchr(local_d8,0x5f);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
    }
    pUVar6 = ures_openDirect_63("icudt63l-curr","supplementalData",&local_124);
    pUVar7 = ures_getByKey_63(pUVar6,"CurrencyMap",pUVar6,&local_124);
    pUVar6 = ures_getByKey_63(pUVar6,local_d8,pUVar7,&local_124);
    bVar9 = true;
    local_108 = pUVar6;
    if (local_124 < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((index < 1) || (iVar2 = ures_getSize_63(pUVar6), iVar2 < index)) {
        ures_close_63(pUVar6);
        goto LAB_002a8e86;
      }
      iVar2 = ures_getSize_63(pUVar6);
      if (iVar2 < 1) {
        src = (UChar *)0x0;
      }
      else {
        local_118 = 0;
        bVar9 = false;
        iVar2 = 0;
        do {
          local_120 = iVar2;
          pUVar6 = ures_getByIndex_63(pUVar6,iVar2,(UResourceBundle *)0x0,&local_124);
          local_e8 = ures_getStringByKey_63(pUVar6,"id",&local_11c,&local_124);
          local_100[1] = 0;
          local_e0 = ures_getByKey_63(pUVar6,"from",(UResourceBundle *)0x0,&local_124);
          piVar8 = ures_getIntVector_63(local_e0,local_100 + 1,&local_124);
          local_f8 = (double)CONCAT44(*piVar8,piVar8[1]);
          iVar2 = ures_getSize_63(pUVar6);
          if (iVar2 < 3) {
            if ((local_f8 <= local_f0) &&
               (uVar3 = (int)local_118 + 1, local_118 = (ulong)uVar3, uVar3 == index)) {
              bVar9 = true;
            }
          }
          else {
            local_100[0] = 0;
            local_110 = pUVar6;
            pUVar7 = ures_getByKey_63(pUVar6,"to",(UResourceBundle *)0x0,&local_124);
            piVar8 = ures_getIntVector_63(pUVar7,local_100,&local_124);
            pUVar6 = local_110;
            if (((local_f8 <= local_f0) && (local_f0 < (double)CONCAT44(*piVar8,piVar8[1]))) &&
               (uVar3 = (int)local_118 + 1, local_118 = (ulong)uVar3, uVar3 == index)) {
              bVar9 = true;
            }
            ures_close_63(pUVar7);
          }
          iVar2 = local_120;
          ures_close_63(pUVar6);
          ures_close_63(local_e0);
          pUVar6 = local_108;
          if (bVar9) break;
          iVar2 = iVar2 + 1;
          iVar4 = ures_getSize_63(local_108);
        } while (iVar2 < iVar4);
        bVar9 = (bool)(bVar9 ^ 1);
        src = local_e8;
      }
    }
    else {
      src = (UChar *)0x0;
    }
    ures_close_63(pUVar6);
    UVar1 = *ec;
    if (local_124 != U_ZERO_ERROR || *ec == U_ZERO_ERROR) {
      *ec = local_124;
      UVar1 = local_124;
    }
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      if (buffCapacity <= local_11c || bVar9) goto LAB_002a8e86;
      u_strcpy_63(buff,src);
    }
    iVar2 = u_terminateUChars_63(buff,buffCapacity,local_11c,ec);
  }
  else {
LAB_002a8e86:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2 
ucurr_forLocaleAndDate(const char* locale, 
                UDate date, 
                int32_t index,
                UChar* buff, 
                int32_t buffCapacity, 
                UErrorCode* ec)
{
    int32_t resLen = 0;
	int32_t currIndex = 0;
    const UChar* s = NULL;

    if (ec != NULL && U_SUCCESS(*ec))
    {
        // check the arguments passed
        if ((buff && buffCapacity) || !buffCapacity )
        {
            // local variables
            UErrorCode localStatus = U_ZERO_ERROR;
            char id[ULOC_FULLNAME_CAPACITY];
            resLen = uloc_getKeywordValue(locale, "currency", id, ULOC_FULLNAME_CAPACITY, &localStatus);

            // get country or country_variant in `id'
            /*uint32_t variantType =*/ idForLocale(locale, id, sizeof(id), ec);
            if (U_FAILURE(*ec))
            {
                return 0;
            }

            // Remove variants, which is only needed for registration.
            char *idDelim = strchr(id, VAR_DELIM);
            if (idDelim)
            {
                idDelim[0] = 0;
            }

            // Look up the CurrencyMap element in the root bundle.
            UResourceBundle *rb = ures_openDirect(U_ICUDATA_CURR, CURRENCY_DATA, &localStatus);
            UResourceBundle *cm = ures_getByKey(rb, CURRENCY_MAP, rb, &localStatus);

            // Using the id derived from the local, get the currency data
            UResourceBundle *countryArray = ures_getByKey(rb, id, cm, &localStatus);

            // process each currency to see which one is valid for the given date
            bool matchFound = false;
            if (U_SUCCESS(localStatus))
            {
                if ((index <= 0) || (index> ures_getSize(countryArray)))
                {
                    // requested index is out of bounds
                    ures_close(countryArray);
                    return 0;
                }

                for (int32_t i=0; i<ures_getSize(countryArray); i++)
                {
                    // get the currency resource
                    UResourceBundle *currencyRes = ures_getByIndex(countryArray, i, NULL, &localStatus);
                    s = ures_getStringByKey(currencyRes, "id", &resLen, &localStatus);

                    // get the from date
                    int32_t fromLength = 0;
                    UResourceBundle *fromRes = ures_getByKey(currencyRes, "from", NULL, &localStatus);
                    const int32_t *fromArray = ures_getIntVector(fromRes, &fromLength, &localStatus);

                    int64_t currDate64 = (int64_t)fromArray[0] << 32;
                    currDate64 |= ((int64_t)fromArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                    UDate fromDate = (UDate)currDate64;

                    if (ures_getSize(currencyRes)> 2)
                    {
                        int32_t toLength = 0;
                        UResourceBundle *toRes = ures_getByKey(currencyRes, "to", NULL, &localStatus);
                        const int32_t *toArray = ures_getIntVector(toRes, &toLength, &localStatus);

                        currDate64 = (int64_t)toArray[0] << 32;
                        currDate64 |= ((int64_t)toArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                        UDate toDate = (UDate)currDate64;

                        if ((fromDate <= date) && (date < toDate))
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }

                        ures_close(toRes);
                    }
                    else
                    {
                        if (fromDate <= date)
                        {
                            currIndex++;
                            if (currIndex == index)
                            {
                                matchFound = true;
                            }
                        }
                    }

                    // close open resources
                    ures_close(currencyRes);
                    ures_close(fromRes);

                    // check for loop exit
                    if (matchFound)
                    {
                        break;
                    }

                } // end For loop
            }

            ures_close(countryArray);

            // Check for errors
            if (*ec == U_ZERO_ERROR || localStatus != U_ZERO_ERROR)
            {
                // There is nothing to fallback to. 
                // Report the failure/warning if possible.
                *ec = localStatus;
            }

            if (U_SUCCESS(*ec))
            {
                // no errors
                if((buffCapacity> resLen) && matchFound)
                {
                    // write out the currency value
                    u_strcpy(buff, s);
                }
                else
                {
                    return 0;
                }
            }

            // return null terminated currency string
            return u_terminateUChars(buff, buffCapacity, resLen, ec);
        }
        else
        {
            // illegal argument encountered
            *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }

    }

    // If we got here, either error code is invalid or
    // some argument passed is no good.
    return resLen;
}